

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WindowCompare(Parse *pParse,Window *p1,Window *p2)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if ((((p1->eFrmType == p2->eFrmType) && (p1->eStart == p2->eStart)) && (p1->eEnd == p2->eEnd)) &&
     (p1->eExclude == p2->eExclude)) {
    iVar1 = sqlite3ExprCompare(pParse,p1->pStart,p2->pStart,-1);
    if (iVar1 == 0) {
      iVar1 = sqlite3ExprCompare(pParse,p1->pEnd,p2->pEnd,-1);
      if (iVar1 == 0) {
        iVar1 = sqlite3ExprListCompare(p1->pPartition,p2->pPartition,-1);
        if (iVar1 == 0) {
          iVar1 = sqlite3ExprListCompare(p1->pOrderBy,p2->pOrderBy,-1);
          uVar2 = (uint)(iVar1 != 0);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowCompare(Parse *pParse, Window *p1, Window *p2){
  if( p1->eFrmType!=p2->eFrmType ) return 1;
  if( p1->eStart!=p2->eStart ) return 1;
  if( p1->eEnd!=p2->eEnd ) return 1;
  if( p1->eExclude!=p2->eExclude ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pStart, p2->pStart, -1) ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pEnd, p2->pEnd, -1) ) return 1;
  if( sqlite3ExprListCompare(p1->pPartition, p2->pPartition, -1) ) return 1;
  if( sqlite3ExprListCompare(p1->pOrderBy, p2->pOrderBy, -1) ) return 1;
  return 0;
}